

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

void tif_3uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar4 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      bVar1 = *pSrc;
      bVar2 = pSrc[1];
      bVar3 = pSrc[2];
      pSrc = pSrc + 3;
      pDst[uVar4] = (uint)(bVar1 >> 5);
      pDst[uVar4 + 1] = bVar1 >> 2 & 7;
      pDst[uVar4 + 2] = (uint)(bVar2 >> 7) + (bVar1 & 3) * 2;
      pDst[uVar4 + 3] = bVar2 >> 4 & 7;
      pDst[uVar4 + 4] = bVar2 >> 1 & 7;
      pDst[uVar4 + 5] = (uint)(bVar3 >> 6) + (bVar2 & 1) * 4;
      pDst[uVar4 + 6] = bVar3 >> 3 & 7;
      pDst[uVar4 + 7] = bVar3 & 7;
      uVar4 = uVar4 + 8;
    } while (uVar4 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    bVar1 = *pSrc;
    pDst[uVar4] = (uint)(bVar1 >> 5);
    uVar5 = (uint)(length & 7);
    if ((uVar5 != 1) && (pDst[uVar4 + 1] = bVar1 >> 2 & 7, 2 < uVar5)) {
      bVar2 = pSrc[1];
      pDst[uVar4 + 2] = (uint)(bVar2 >> 7) + (bVar1 & 3) * 2;
      if ((uVar5 != 3) && (pDst[uVar4 + 3] = bVar2 >> 4 & 7, 4 < uVar5)) {
        pDst[uVar4 + 4] = bVar2 >> 1 & 7;
        if (uVar5 != 5) {
          bVar1 = pSrc[2];
          pDst[uVar4 + 5] = (uint)(bVar1 >> 6) + (bVar2 & 1) * 4;
          if (uVar5 == 7) {
            pDst[uVar4 + 6] = bVar1 >> 3 & 7;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_3uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 >> 5));
		pDst[i+1] = (OPJ_INT32)(((val0 & 0x1FU) >> 2));
		pDst[i+2] = (OPJ_INT32)(((val0 & 0x3U) << 1) | (val1 >> 7));
		pDst[i+3] = (OPJ_INT32)(((val1 & 0x7FU) >> 4));
		pDst[i+4] = (OPJ_INT32)(((val1 & 0xFU) >> 1));
		pDst[i+5] = (OPJ_INT32)(((val1 & 0x1U) << 2) | (val2 >> 6));
		pDst[i+6] = (OPJ_INT32)(((val2 & 0x3FU) >> 3));
		pDst[i+7] = (OPJ_INT32)(((val2 & 0x7U)));
		
	}
	if (length & 7U) {
		unsigned int val;
		int available = 0;
		
		length = length & 7U;
		
		GETBITS(pDst[i+0], 3)
		
		if (length > 1U) {
			GETBITS(pDst[i+1], 3)
			if (length > 2U) {
				GETBITS(pDst[i+2], 3)
				if (length > 3U) {
					GETBITS(pDst[i+3], 3)
					if (length > 4U) {
						GETBITS(pDst[i+4], 3)
						if (length > 5U) {
							GETBITS(pDst[i+5], 3)
							if (length > 6U) {
								GETBITS(pDst[i+6], 3)
							}
						}
					}
				}
			}
		}
	}
}